

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O0

bool __thiscall
QJulianCalendar::dateToJulianDay(QJulianCalendar *this,int year,int month,int day,qint64 *jd)

{
  long lVar1;
  ulong uVar2;
  longlong lVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  long *in_R8;
  long in_FS_OFFSET;
  bool bVar4;
  R_conflict18 RVar5;
  R_conflict18 yearDays;
  long local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,in_ESI,in_EDX,in_ECX);
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    RVar5 = QRomanCalendrical::yearMonthToYearDays(0,0x57ba03);
    lVar3 = QRoundingDown::qDiv<4u,long_long>((longlong)in_R8);
    local_10 = RVar5.days;
    *in_R8 = lVar3 + local_10 + (long)in_ECX + 0x1a431d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QJulianCalendar::dateToJulianDay(int year, int month, int day, qint64 *jd) const
{
    Q_ASSERT(jd);
    if (!isDateValid(year, month, day))
        return false;

    const auto yearDays = yearMonthToYearDays(year, month);
    *jd = qDiv<4>(FourYears * yearDays.year) + yearDays.days + day + JulianBaseJd;
    return true;
}